

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O2

void __thiscall r_exec::InputLessPGMOverlay::reset(InputLessPGMOverlay *this)

{
  pointer puVar1;
  
  Overlay::reset(&this->super_Overlay);
  patch_tpl_args(this);
  puVar1 = (this->super_Overlay).patch_indices.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_Overlay).patch_indices.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->super_Overlay).patch_indices.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  (this->super_Overlay).value_commit_index = 0;
  std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::clear
            (&(this->super_Overlay).values.m_vector);
  std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::clear
            (&this->productions);
  return;
}

Assistant:

inline void InputLessPGMOverlay::reset()
{
    Overlay::reset();
    patch_tpl_args();
    patch_indices.clear();
    value_commit_index = 0;
    values.as_std()->clear();
    productions.clear();
}